

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall
nvim::Nvim::async_buf_set_option(Nvim *this,Buffer buffer,string *name,Object *value)

{
  allocator local_51;
  Buffer local_50;
  string local_48;
  
  local_50 = buffer;
  std::__cxx11::string::string((string *)&local_48,"nvim_buf_set_option",&local_51);
  NvimRPC::
  async_call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_48,&local_50,name,value);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Nvim::async_buf_set_option(Buffer buffer, const std::string& name, const Object& value) {
    client_.async_call("nvim_buf_set_option", buffer, name, value);
}